

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::FocusableItemRegister(ImGuiWindow *window,ImGuiID id)

{
  int *piVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  int iVar5;
  
  pIVar3 = GImGui;
  uVar2 = (window->DC).ItemFlags;
  iVar5 = (window->DC).FocusCounterRegular + 1;
  (window->DC).FocusCounterRegular = iVar5;
  if ((uVar2 & 5) == 0) {
    piVar1 = &(window->DC).FocusCounterTabStop;
    *piVar1 = *piVar1 + 1;
  }
  if ((((pIVar3->ActiveId == id) && (pIVar3->FocusTabPressed == true)) &&
      ((pIVar3->ActiveIdUsingKeyInputMask & 1) == 0)) &&
     (pIVar3->FocusRequestNextWindow == (ImGuiWindow *)0x0)) {
    pIVar3->FocusRequestNextWindow = window;
    iVar4 = 1;
    if ((pIVar3->IO).KeyShift != false) {
      iVar4 = -(uint)((uVar2 & 5) == 0);
    }
    pIVar3->FocusRequestNextCounterTabStop = iVar4 + (window->DC).FocusCounterTabStop;
  }
  if (pIVar3->FocusRequestCurrWindow == window) {
    if (iVar5 == pIVar3->FocusRequestCurrCounterRegular) {
      return true;
    }
    if (((uVar2 & 5) == 0) &&
       ((window->DC).FocusCounterTabStop == pIVar3->FocusRequestCurrCounterTabStop)) {
      pIVar3->NavJustTabbedId = id;
      return true;
    }
    if (pIVar3->ActiveId == id) {
      ClearActiveID();
      return false;
    }
  }
  return false;
}

Assistant:

bool ImGui::FocusableItemRegister(ImGuiWindow* window, ImGuiID id)
{
    ImGuiContext& g = *GImGui;

    // Increment counters
    const bool is_tab_stop = (window->DC.ItemFlags & (ImGuiItemFlags_NoTabStop | ImGuiItemFlags_Disabled)) == 0;
    window->DC.FocusCounterRegular++;
    if (is_tab_stop)
        window->DC.FocusCounterTabStop++;

    // Process TAB/Shift-TAB to tab *OUT* of the currently focused item.
    // (Note that we can always TAB out of a widget that doesn't allow tabbing in)
    if (g.ActiveId == id && g.FocusTabPressed && !IsActiveIdUsingKey(ImGuiKey_Tab) && g.FocusRequestNextWindow == NULL)
    {
        g.FocusRequestNextWindow = window;
        g.FocusRequestNextCounterTabStop = window->DC.FocusCounterTabStop + (g.IO.KeyShift ? (is_tab_stop ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.
    }

    // Handle focus requests
    if (g.FocusRequestCurrWindow == window)
    {
        if (window->DC.FocusCounterRegular == g.FocusRequestCurrCounterRegular)
            return true;
        if (is_tab_stop && window->DC.FocusCounterTabStop == g.FocusRequestCurrCounterTabStop)
        {
            g.NavJustTabbedId = id;
            return true;
        }

        // If another item is about to be focused, we clear our own active id
        if (g.ActiveId == id)
            ClearActiveID();
    }

    return false;
}